

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O1

bool __thiscall QFSFileEngine::setPermissions(QFSFileEngine *this,uint perms)

{
  QAbstractFileEnginePrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QSystemError error;
  QString local_40;
  QSystemError local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  local_28.errorCode = 0;
  local_28.errorScope = NoError;
  *(uint *)&pQVar1[2].errorString.d.d = *(uint *)&pQVar1[2].errorString.d.d & 0xffff8888;
  if (*(int *)&pQVar1[3].q_ptr == -1) {
    bVar2 = QFileSystemEngine::setPermissions
                      ((QFileSystemEntry *)(pQVar1 + 1),(Permissions)perms,&local_28);
  }
  else {
    bVar2 = QFileSystemEngine::setPermissions(*(int *)&pQVar1[3].q_ptr,(Permissions)perms,&local_28)
    ;
  }
  if (bVar2 == false) {
    QSystemError::string(&local_40,local_28.errorScope,local_28.errorCode);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,PermissionsError,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setPermissions(uint perms)
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ok;

    // clear cached state (if any)
    d->metaData.clearFlags(QFileSystemMetaData::Permissions);

    if (d->fd != -1)
        ok = QFileSystemEngine::setPermissions(d->fd, QFile::Permissions(perms), error);
    else
        ok = QFileSystemEngine::setPermissions(d->fileEntry, QFile::Permissions(perms), error);
    if (!ok) {
        setError(QFile::PermissionsError, error.toString());
        return false;
    }
    return true;
}